

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpoint.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QPoint *p)

{
  long lVar1;
  QDebug *pQVar2;
  int *in_RDX;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)p);
  *(undefined1 *)((long)*p + 0x30) = 0;
  pQVar2 = QDebug::operator<<((QDebug *)p,"QPoint");
  QDebug::operator<<(pQVar2,'(');
  pQVar2 = QDebug::operator<<((QDebug *)p,*in_RDX);
  pQVar2 = QDebug::operator<<(pQVar2,',');
  QDebug::operator<<(pQVar2,in_RDX[1]);
  QDebug::operator<<((QDebug *)p,')');
  p->xp = 0;
  p->yp = 0;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)*p;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QPoint &p)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QPoint" << '(';
    QtDebugUtils::formatQPoint(dbg, p);
    dbg << ')';
    return dbg;
}